

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O0

int __thiscall ncnn::Reshape::forward(Reshape *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  reference pvVar3;
  undefined8 in_RCX;
  reference in_RDX;
  reference in_RSI;
  long *in_RDI;
  int ret;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  allocator_type *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffef0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_00;
  undefined1 local_d9 [49];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_a8;
  undefined8 local_90;
  reference local_88;
  reference local_80;
  int local_70;
  undefined4 local_6c;
  reference local_68;
  reference local_60;
  int local_50;
  undefined4 local_4c;
  reference local_48;
  reference local_40;
  reference local_38;
  int local_30;
  undefined4 local_2c;
  reference local_28;
  int local_20;
  undefined4 local_1c;
  reference local_18;
  void *local_10;
  void *local_8;
  
  local_90 = in_RCX;
  local_88 = in_RDX;
  local_80 = in_RSI;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0xf7e586);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (in_stack_fffffffffffffef0,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
             ,in_stack_fffffffffffffee0);
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0xf7e5ac);
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_a8,0);
  local_48 = local_80;
  local_40 = pvVar3;
  if (pvVar3 != local_80) {
    if (local_80->refcount != (int *)0x0) {
      piVar1 = local_80->refcount;
      local_4c = 1;
      LOCK();
      local_50 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_28 = pvVar3;
    if (pvVar3->refcount != (int *)0x0) {
      piVar1 = pvVar3->refcount;
      local_2c = 0xffffffff;
      LOCK();
      local_30 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_30 == 1) {
        if (pvVar3->allocator == (Allocator *)0x0) {
          local_8 = pvVar3->data;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (*pvVar3->allocator->_vptr_Allocator[3])(pvVar3->allocator,pvVar3->data);
        }
      }
    }
    pvVar3->data = (void *)0x0;
    pvVar3->elemsize = 0;
    pvVar3->elempack = 0;
    pvVar3->dims = 0;
    pvVar3->w = 0;
    pvVar3->h = 0;
    pvVar3->d = 0;
    pvVar3->c = 0;
    pvVar3->cstep = 0;
    pvVar3->refcount = (int *)0x0;
    pvVar3->data = local_48->data;
    pvVar3->refcount = local_48->refcount;
    pvVar3->elemsize = local_48->elemsize;
    pvVar3->elempack = local_48->elempack;
    pvVar3->allocator = local_48->allocator;
    pvVar3->dims = local_48->dims;
    pvVar3->w = local_48->w;
    pvVar3->h = local_48->h;
    pvVar3->d = local_48->d;
    pvVar3->c = local_48->c;
    pvVar3->cstep = local_48->cstep;
  }
  this_00 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_d9;
  local_38 = pvVar3;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0xf7e7f5);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (this_00,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0);
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0xf7e815);
  iVar2 = (**(code **)(*in_RDI + 0x30))(in_RDI,&local_a8,local_d9 + 1,local_90);
  local_68 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(local_d9 + 1),0);
  local_60 = local_88;
  pvVar3 = local_88;
  if (local_88 != local_68) {
    if (local_68->refcount != (int *)0x0) {
      piVar1 = local_68->refcount;
      local_6c = 1;
      LOCK();
      local_70 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_18 = local_88;
    if (local_88->refcount != (int *)0x0) {
      piVar1 = local_88->refcount;
      local_1c = 0xffffffff;
      LOCK();
      local_20 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_20 == 1) {
        if (local_88->allocator == (Allocator *)0x0) {
          local_10 = local_88->data;
          if (local_10 != (void *)0x0) {
            free(local_10);
          }
        }
        else {
          (*local_88->allocator->_vptr_Allocator[3])(local_88->allocator,local_88->data);
        }
      }
    }
    local_88->data = (void *)0x0;
    local_88->elemsize = 0;
    local_88->elempack = 0;
    local_88->dims = 0;
    local_88->w = 0;
    local_88->h = 0;
    local_88->d = 0;
    local_88->c = 0;
    local_88->cstep = 0;
    local_88->refcount = (int *)0x0;
    pvVar3->data = local_68->data;
    pvVar3->refcount = local_68->refcount;
    pvVar3->elemsize = local_68->elemsize;
    pvVar3->elempack = local_68->elempack;
    pvVar3->allocator = local_68->allocator;
    pvVar3->dims = local_68->dims;
    pvVar3->w = local_68->w;
    pvVar3->h = local_68->h;
    pvVar3->d = local_68->d;
    pvVar3->c = local_68->c;
    pvVar3->cstep = local_68->cstep;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pvVar3);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pvVar3);
  return iVar2;
}

Assistant:

int Reshape::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    std::vector<Mat> bottom_blobs(1);
    bottom_blobs[0] = bottom_blob;
    std::vector<Mat> top_blobs(1);
    int ret = forward(bottom_blobs, top_blobs, opt);
    top_blob = top_blobs[0];
    return ret;
}